

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromise_p.h
# Opt level: O2

void __thiscall
QtPromisePrivate::PromiseDataBase<std::shared_ptr<int>,_void_(const_std::shared_ptr<int>_&)>::
reject<int>(PromiseDataBase<std::shared_ptr<int>,_void_(const_std::shared_ptr<int>_&)> *this,
           int *error)

{
  exception_ptr eStack_18;
  
  PromiseError::PromiseError<int>((PromiseError *)&eStack_18,error);
  std::__exception_ptr::exception_ptr::operator=(&(this->m_error).m_data,&eStack_18);
  std::__exception_ptr::exception_ptr::~exception_ptr(&eStack_18);
  setSettled(this);
  return;
}

Assistant:

void reject(E&& error)
    {
        Q_ASSERT(isPending());
        Q_ASSERT(m_error.isNull());
        m_error = PromiseError{std::forward<E>(error)};
        setSettled();
    }